

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.hpp
# Opt level: O2

json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
nlohmann::json_abi_v3_11_2::
json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator/=(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,size_t array_idx)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,array_idx);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

json_pointer& operator/=(std::size_t array_idx)
    {
        return *this /= std::to_string(array_idx);
    }